

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_load(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  CHAR_DATA *ch_00;
  char arg [4608];
  char *in_stack_00001218;
  CHAR_DATA *in_stack_00001220;
  char in_stack_ffffffffffffede8;
  undefined7 in_stack_ffffffffffffede9;
  char *in_stack_ffffffffffffedf0;
  CHAR_DATA *in_stack_ffffffffffffedf8;
  undefined4 in_stack_ffffffffffffee00;
  int in_stack_ffffffffffffee04;
  char *in_stack_ffffffffffffee08;
  CHAR_DATA *in_stack_ffffffffffffee10;
  char *in_stack_ffffffffffffffe8;
  
  log_naughty(in_stack_ffffffffffffee10,in_stack_ffffffffffffee08,in_stack_ffffffffffffee04);
  ch_00 = (CHAR_DATA *)
          one_argument(in_stack_ffffffffffffedf0,
                       (char *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
  if (in_stack_ffffffffffffede8 == '\0') {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
                 in_stack_ffffffffffffedf8);
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
                 in_stack_ffffffffffffedf8);
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffee04,in_stack_ffffffffffffee00),
                 in_stack_ffffffffffffedf8);
  }
  else {
    bVar1 = str_cmp(&stack0xffffffffffffede8,"mob");
    if ((bVar1) && (bVar1 = str_cmp(&stack0xffffffffffffede8,"char"), bVar1)) {
      bVar1 = str_cmp(&stack0xffffffffffffede8,"obj");
      if (bVar1) {
        do_load(ch_00,in_stack_ffffffffffffffe8);
      }
      else {
        do_oload(in_stack_00001220,in_stack_00001218);
      }
    }
    else {
      do_mload(ch,argument);
    }
  }
  return;
}

Assistant:

void do_load(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	log_naughty(ch, argument, 1);
	argument = one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  load mob <vnum>\n\r", ch);
		send_to_char("  load obj <vnum> <level>\n\r", ch);
		return;
	}

	if (!str_cmp(arg, "mob") || !str_cmp(arg, "char"))
	{
		do_mload(ch, argument);
		return;
	}

	if (!str_cmp(arg, "obj"))
	{
		do_oload(ch, argument);
		return;
	}

	/* echo syntax */
	do_load(ch, "");
}